

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_MAP_AREA(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  short sVar3;
  short sVar4;
  player_upkeep *ppVar5;
  int iVar6;
  chunk_conflict *pcVar7;
  _Bool _Var8;
  loc lVar9;
  loc lVar10;
  int iVar11;
  int iVar12;
  wchar_t wVar13;
  int iVar14;
  wchar_t wVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  source origin;
  int local_50;
  
  wVar13 = context->y;
  if (wVar13 == L'\0') {
    wVar13 = (context->value).dice;
  }
  wVar15 = context->x;
  if (wVar15 == L'\0') {
    wVar15 = (context->value).sides;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  lVar9 = origin_get_loc(origin);
  iVar11 = lVar9.x - wVar15;
  iVar16 = wVar15 + lVar9.x;
  iVar12 = lVar9.y - wVar13;
  iVar14 = wVar13 + lVar9.y;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  iVar6 = cave->height + -1;
  if (iVar14 < cave->height) {
    iVar6 = iVar14;
  }
  iVar14 = cave->width + -1;
  if (iVar16 < cave->width) {
    iVar14 = iVar16;
  }
  local_50 = iVar12;
  if (iVar12 < iVar6) {
    do {
      iVar16 = iVar11;
      if (iVar11 < iVar14) {
        do {
          lVar9 = (loc)loc(iVar16,local_50);
          _Var8 = square_isno_map(cave,lVar9);
          if (!_Var8) {
            _Var8 = square_seemslikewall(cave,lVar9);
            if (!_Var8) {
              _Var8 = square_in_bounds_fully(cave,lVar9);
              if (!_Var8) goto LAB_0013ddd1;
              _Var8 = square_isfloor(cave,lVar9);
              if (!_Var8) {
                square_memorize(cave,lVar9);
              }
              lVar17 = 0;
              do {
                pcVar7 = cave;
                sVar3 = ddy_ddd[lVar17];
                sVar4 = ddx_ddd[lVar17];
                lVar10 = (loc)loc(sVar4 + iVar16,sVar3 + local_50);
                _Var8 = square_seemslikewall(pcVar7,lVar10);
                pcVar7 = cave;
                if (_Var8) {
                  lVar10 = (loc)loc(sVar4 + iVar16,sVar3 + local_50);
                  square_memorize(pcVar7,lVar10);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 != 8);
            }
            _Var8 = square_ismemorybad(cave,lVar9);
            if (_Var8) {
              square_forget(cave,lVar9);
            }
          }
LAB_0013ddd1:
          iVar16 = iVar16 + 1;
        } while (iVar16 != iVar14);
      }
      local_50 = local_50 + 1;
    } while (local_50 != iVar6);
  }
  if (iVar12 + -1 <= iVar6) {
    iVar12 = iVar12 + -1;
    do {
      iVar16 = iVar11 + -1;
      if (iVar11 + -1 <= iVar14) {
        do {
          lVar9 = (loc)loc(iVar16,iVar12);
          _Var8 = square_in_bounds(cave,lVar9);
          if (_Var8) {
            square_unmark(cave,lVar9);
          }
          bVar18 = iVar16 != iVar14;
          iVar16 = iVar16 + 1;
        } while (bVar18);
      }
      bVar18 = iVar12 != iVar6;
      iVar12 = iVar12 + 1;
    } while (bVar18);
  }
  ppVar5 = player->upkeep;
  puVar1 = &ppVar5->update;
  *puVar1 = *puVar1 | 0x60;
  pbVar2 = (byte *)((long)&ppVar5->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc1;
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_MAP_AREA(effect_handler_context_t *context)
{
	int i, x, y;
	int x1, x2, y1, y2;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	struct loc centre = origin_get_loc(context->origin);

	/* Pick an area to map */
	y1 = centre.y - dist_y;
	y2 = centre.y + dist_y;
	x1 = centre.x - dist_x;
	x2 = centre.x + dist_x;

	/* Drag the co-ordinates into the dungeon */
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Some squares can't be mapped */
			if (square_isno_map(cave, grid)) continue;

			/* All non-walls are "checked" */
			if (!square_seemslikewall(cave, grid)) {
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Memorize normal features */
				if (!square_isfloor(cave, grid))
					square_memorize(cave, grid);

				/* Memorize known walls */
				for (i = 0; i < 8; i++) {
					int yy = y + ddy_ddd[i];
					int xx = x + ddx_ddd[i];

					/* Memorize walls (etc) */
					if (square_seemslikewall(cave, loc(xx, yy)))
						square_memorize(cave, loc(xx, yy));
				}
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (square_ismemorybad(cave, grid)) {
				square_forget(cave, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = y1 - 1; y < y2 + 1; y++) {
		for (x = x1 - 1; x < x2 + 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(cave, grid)) continue;
			square_unmark(cave, grid);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);

	/* Notice */
	context->ident = true;

	return true;
}